

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknetshortcut.cpp
# Opt level: O0

int __thiscall
ncnn::DarknetShortcut::forward
          (DarknetShortcut *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  int iVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  void *in_R8;
  int i;
  float *outptr;
  float *ptr2;
  float *ptr1;
  int hi;
  int in_offset_h;
  int out_offset_h;
  int q;
  size_t elemsize;
  Mat *top_blob;
  int op_c;
  int op_h;
  int op_w;
  int o_stride;
  int i_stride;
  int o_c;
  int o_h;
  int o_w;
  Mat *bottom_blob1;
  int c;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffffdf0;
  Mat *in_stack_fffffffffffffdf8;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1b4;
  Mat local_1b0;
  Mat *local_170;
  Mat local_168;
  float *local_128;
  Mat local_120;
  float *local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  Mat local_b8;
  size_t local_78;
  reference local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  const_reference local_48;
  int local_3c;
  int local_38;
  int local_34;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->w;
  local_38 = local_30->h;
  local_3c = local_30->c;
  local_48 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_4c = local_48->w;
  local_50 = local_48->h;
  local_54 = local_48->c;
  local_1c8 = local_34 / local_4c;
  local_1cc = local_4c / local_34;
  if (local_1c8 == local_38 / local_50) {
    iVar3 = local_50 / local_38;
    if (local_1cc == iVar3) {
      if (local_1c8 < 1) {
        local_1c8 = 1;
      }
      local_58 = local_1c8;
      if (local_1cc < 1) {
        local_1cc = 1;
      }
      local_5c = local_1cc;
      local_1d0 = local_4c;
      if (local_34 < local_4c) {
        local_1d0 = local_34;
      }
      local_60 = local_1d0;
      local_1d4 = local_50;
      if (local_38 < local_50) {
        local_1d4 = local_38;
      }
      local_64 = local_1d4;
      local_1d8 = local_54;
      if (local_3c < local_54) {
        local_1d8 = local_3c;
      }
      local_68 = local_1d8;
      local_70 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
      local_78 = local_30->elemsize;
      Mat::clone(&local_b8,(__fn *)local_48,(void *)0x0,iVar3,in_R8);
      Mat::operator=(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      Mat::~Mat((Mat *)0x1b5958);
      bVar1 = Mat::empty(in_stack_fffffffffffffdf0);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_c8 = 0; local_c8 < local_68; local_c8 = local_c8 + 1) {
          local_cc = 0;
          local_d0 = 0;
          for (local_d4 = 0; iVar3 = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
              local_d4 < local_64; local_d4 = local_d4 + 1) {
            Mat::channel(in_stack_fffffffffffffdf8,iVar3);
            pfVar2 = Mat::row(&local_120,local_d0);
            Mat::~Mat((Mat *)0x1b5a3b);
            in_stack_fffffffffffffdf8 = &local_168;
            local_e0 = pfVar2;
            Mat::channel(in_stack_fffffffffffffdf8,iVar3);
            pfVar2 = Mat::row(in_stack_fffffffffffffdf8,local_cc);
            Mat::~Mat((Mat *)0x1b5a8e);
            local_128 = pfVar2;
            Mat::channel(in_stack_fffffffffffffdf8,iVar3);
            in_stack_fffffffffffffdf0 = (Mat *)Mat::row(&local_1b0,local_cc);
            Mat::~Mat((Mat *)0x1b5ad9);
            local_cc = local_5c + local_cc;
            local_d0 = local_58 + local_d0;
            local_170 = in_stack_fffffffffffffdf0;
            for (local_1b4 = 0; local_1b4 < local_60; local_1b4 = local_1b4 + 1) {
              *(float *)&local_170->data =
                   *(float *)(in_RDI + 0xb8) * *local_128 + *(float *)(in_RDI + 0xbc) * *local_e0;
              local_128 = local_128 + local_5c;
              local_e0 = local_e0 + local_58;
              local_170 = (Mat *)((long)&local_170->data + (long)local_5c * 4);
            }
          }
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int DarknetShortcut::forward(const std::vector<Mat> &bottom_blobs,
                             std::vector<Mat> &top_blobs,
                             const Option &opt) const
{
  const Mat &bottom_blob = bottom_blobs[0];
  int w = bottom_blob.w;
  int h = bottom_blob.h;
  int c = bottom_blob.c;

  const Mat &bottom_blob1 = bottom_blobs[1];
  int o_w = bottom_blob1.w;
  int o_h = bottom_blob1.h;
  int o_c = bottom_blob1.c;

  int i_stride = w / o_w;
  int o_stride = o_w / w;
  if (i_stride != h / o_h) return -1;
  if (o_stride != o_h / h) return -1;
  i_stride = i_stride < 1 ? 1 : i_stride;
  o_stride = o_stride < 1 ? 1 : o_stride;

  int op_w = w < o_w ? w : o_w;
  int op_h = h < o_h ? h : o_h;
  int op_c = c < o_c ? c : o_c;

  Mat &top_blob = top_blobs[0];
  size_t elemsize = bottom_blob.elemsize;
  top_blob = bottom_blob1.clone();
  if (top_blob.empty())
    return -100;

  #pragma omp parallel for num_threads(opt.num_threads)
  for (int q = 0; q < op_c; q++)
  {

    int out_offset_h = 0;
    int in_offset_h = 0;

    for (int hi = 0; hi < op_h; hi++)
    {

      const float *ptr1 = bottom_blob.channel(q).row(in_offset_h);
      const float *ptr2 = bottom_blob1.channel(q).row(out_offset_h);
      float *outptr = top_blob.channel(q).row(out_offset_h);

      out_offset_h += o_stride;
      in_offset_h += i_stride;

      for (int i = 0; i < op_w; i++)
      {
        *outptr = alpha * (*ptr2) + beta * (*ptr1);

        ptr2 += o_stride;
        ptr1 += i_stride;
        outptr += o_stride;
      }
    }
  }

  return 0;
}